

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

void lj_debug_pushloc(lua_State *L,GCproto *pt,BCPos pc)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  GCproto *pGVar7;
  
  uVar6 = (ulong)(pt->chunkname).gcptr32;
  pGVar7 = (GCproto *)(uVar6 + 0x10);
  uVar2 = *(uint *)(uVar6 + 0xc);
  uVar3 = lj_debug_line(pt,pc);
  if (pt->firstline == -1) {
    lj_strfmt_pushf(L,"builtin:%s",pGVar7);
    return;
  }
  cVar1 = (char)(pGVar7->nextgc).gcptr32;
  if (cVar1 == '@') {
    uVar4 = uVar2 + 1;
    pcVar5 = (char *)(uVar6 + (uVar2 - 1) + 0x11);
    pGVar7 = (GCproto *)(uVar6 + 0x11);
    do {
      if (uVar4 == 2) goto LAB_0010c15b;
      cVar1 = *pcVar5;
      uVar4 = uVar4 - 1;
    } while ((cVar1 != '\\') && (pcVar5 = pcVar5 + -1, cVar1 != '/'));
    pGVar7 = (GCproto *)((long)&(pGVar7->nextgc).gcptr32 + (ulong)uVar4);
  }
  else {
    if (0x28 < uVar2) {
      pcVar5 = "%p:%d";
      pGVar7 = pt;
      goto LAB_0010c168;
    }
    if (cVar1 != '=') {
      pcVar5 = "\"%s\":%d";
      goto LAB_0010c168;
    }
    pGVar7 = (GCproto *)(uVar6 + 0x11);
  }
LAB_0010c15b:
  pcVar5 = "%s:%d";
LAB_0010c168:
  lj_strfmt_pushf(L,pcVar5,pGVar7,(ulong)uVar3);
  return;
}

Assistant:

void lj_debug_pushloc(lua_State *L, GCproto *pt, BCPos pc)
{
  GCstr *name = proto_chunkname(pt);
  const char *s = strdata(name);
  MSize i, len = name->len;
  BCLine line = lj_debug_line(pt, pc);
  if (pt->firstline == ~(BCLine)0) {
    lj_strfmt_pushf(L, "builtin:%s", s);
  } else if (*s == '@') {
    s++; len--;
    for (i = len; i > 0; i--)
      if (s[i] == '/' || s[i] == '\\') {
	s += i+1;
	break;
      }
    lj_strfmt_pushf(L, "%s:%d", s, line);
  } else if (len > 40) {
    lj_strfmt_pushf(L, "%p:%d", pt, line);
  } else if (*s == '=') {
    lj_strfmt_pushf(L, "%s:%d", s+1, line);
  } else {
    lj_strfmt_pushf(L, "\"%s\":%d", s, line);
  }
}